

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::storeResultPixels
          (SRGBTestCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *resultPixelData)

{
  int iVar1;
  TestContext *this_00;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar3;
  reference this_01;
  reference v;
  MessageBuilder *pMVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  allocator<char> local_3c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  MessageBuilder local_3a8;
  Vector<float,_4> local_224;
  allocator<char> local_211;
  string local_210;
  PixelBufferAccess local_1f0;
  int local_1b4;
  int local_1b0;
  int idx;
  int height;
  int local_19c;
  undefined1 local_198 [4];
  int width;
  ostringstream message;
  TestLog *log;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *resultPixelData_local;
  SRGBTestCase *this_local;
  
  this_00 = gles31::Context::getTestContext((this->super_TestCase).m_context);
  message._368_8_ = tcu::TestContext::getLog(this_00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[4])();
  local_19c = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar1));
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[4])();
  local_1b0 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar1));
  for (local_1b4 = 0; iVar1 = local_1b4,
      sVar3 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::size
                        (&this->m_textureResultList), iVar1 < (int)sVar3; local_1b4 = local_1b4 + 1)
  {
    this_01 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                        (&this->m_textureResultList,(long)local_1b4);
    tcu::TextureLevel::getAccess(&local_1f0,this_01);
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)&stack0xfffffffffffffe3c,(int)&local_1f0,this->m_px,
               this->m_py);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (resultPixelData,(value_type *)&stack0xfffffffffffffe3c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"Result color: ",&local_211);
    iVar1 = local_1b4;
    v = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                  (resultPixelData,(long)local_1b4);
    tcu::Vector<float,_4>::Vector(&local_224,v);
    logColor(this,&local_210,iVar1,&local_224);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
  }
  tcu::operator<<((ostream *)local_198,&this->m_epsilonError);
  tcu::TestLog::operator<<
            (&local_3a8,(TestLog *)message._368_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"Epsilon error: ",&local_3c9);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_3a8,&local_3c8);
  std::__cxx11::ostringstream::str();
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_3f0);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  tcu::MessageBuilder::~MessageBuilder(&local_3a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return;
}

Assistant:

void SRGBTestCase::storeResultPixels (std::vector<tcu::Vec4>& resultPixelData)
{
	tcu::TestLog&		log			= m_context.getTestContext().getLog();
	std::ostringstream	message;
	int					width		= m_context.getRenderContext().getRenderTarget().getWidth();
	int					height		= m_context.getRenderContext().getRenderTarget().getHeight();

	// ensure result sampling coordinates are within range of the result color attachment
	DE_ASSERT((m_px >= 0) && (m_px < width));
	DE_ASSERT((m_py >= 0) && (m_py < height));
	DE_UNREF(width && height);

	for (int idx = 0; idx < (int)m_textureResultList.size(); idx++)
	{
		resultPixelData.push_back(m_textureResultList[idx].getAccess().getPixel(m_px, m_py));
		this->logColor(std::string("Result color: "), idx, resultPixelData[idx]);
	}

	// log error rate (threshold)
	message << m_epsilonError;
	log << tcu::TestLog::Message << std::string("Epsilon error: ") << message.str() << tcu::TestLog::EndMessage;
}